

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O1

bool read_from_descriptor(DESCRIPTOR_DATA *d)

{
  char *__s;
  int iVar1;
  char *in_RAX;
  size_t sVar2;
  ssize_t sVar3;
  int *piVar4;
  int iVar5;
  bool bVar6;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  char *local_38;
  
  bVar6 = true;
  if (d->incomm[0] == '\0') {
    __s = d->inbuf;
    local_38 = in_RAX;
    sVar2 = strlen(__s);
    if (((uint)sVar2 & 0xfffffffe) < 0x47f6) {
      do {
        sVar3 = read((int)d->descriptor,__s + (sVar2 & 0xffffffff),0x47f6 - (sVar2 & 0xffffffff));
        iVar1 = (int)sVar3;
        if (iVar1 < 1) {
          if (iVar1 == 0) {
            fmt_01._M_str = "EOF encountered on read.";
            fmt_01._M_len = 0x18;
            CLogger::Info<>((CLogger *)&RS.field_0x140,fmt_01);
          }
          else {
            piVar4 = __errno_location();
            iVar5 = 2;
            if (*piVar4 == 0xb) goto LAB_0027a03c;
            local_38 = strerror(*piVar4);
            fmt_00._M_str = "Init_descriptor: read: {}";
            fmt_00._M_len = 0x19;
            CLogger::Warn<char*>((CLogger *)&RS.field_0x140,fmt_00,&local_38);
          }
          iVar5 = 1;
        }
        else {
          iVar5 = 2;
          if ((__s[(iVar1 + (int)sVar2) - 1] != '\n') && (__s[(iVar1 + (int)sVar2) - 1] != '\r')) {
            iVar5 = 0;
          }
          sVar2 = (size_t)(uint)((int)sVar2 + iVar1);
        }
LAB_0027a03c:
      } while (iVar5 == 0);
      if (iVar5 == 2) {
        __s[sVar2 & 0xffffffff] = '\0';
      }
      else {
        bVar6 = false;
      }
    }
    else {
      fmt._M_str = "{} input overflow!";
      fmt._M_len = 0x12;
      CLogger::Info<char*&>((CLogger *)&RS.field_0x140,fmt,&d->host);
      bVar6 = false;
      write_to_descriptor((int)d->descriptor,"\n\r*** PUT A LID ON IT!!! ***\n\r",0);
    }
  }
  return bVar6;
}

Assistant:

bool read_from_descriptor(DESCRIPTOR_DATA *d)
{
	unsigned int iStart;

	/* Hold horses if pending command already. */
	if (d->incomm[0] != '\0')
		return true;

	/* Check for overflow. */
	iStart = strlen(d->inbuf);
	if (iStart >= sizeof(d->inbuf) - 10)
	{
		RS.Logger.Info("{} input overflow!", d->host);

		write_to_descriptor(d->descriptor, "\n\r*** PUT A LID ON IT!!! ***\n\r", 0);
		return false;
	}

	for (;;)
	{
		int nRead = read(d->descriptor, d->inbuf + iStart, sizeof(d->inbuf) - 10 - iStart);

		if (nRead > 0)
		{
			iStart += nRead;

			if (d->inbuf[iStart - 1] == '\n' || d->inbuf[iStart - 1] == '\r')
				break;
		}
		else if (nRead == 0)
		{
			RS.Logger.Info("EOF encountered on read.");
			return false;
		}
		else if (errno == EAGAIN)
		{
			break;
		}
		else
		{
			RS.Logger.Warn("Init_descriptor: read: {}", std::strerror(errno));
			return false;
		}
	}

	d->inbuf[iStart] = '\0';
	return true;
}